

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_set_adapter_lora
               (llama_context *ctx,
               vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *lora)

{
  bool bVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  common_adapter_lora_info *la;
  iterator __end1;
  iterator __begin1;
  vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_> *__range1;
  vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
  local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  llama_clear_adapter_lora(in_RDI);
  local_18 = local_10;
  local_20._M_current =
       (common_adapter_lora_info *)
       std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::end
            (in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                             *)in_stack_ffffffffffffffd0,
                            (__normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
                             *)in_stack_ffffffffffffffc8), bVar1) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
         ::operator*(&local_20);
    if ((in_stack_ffffffffffffffd0->scale != 0.0) || (NAN(in_stack_ffffffffffffffd0->scale))) {
      llama_set_adapter_lora
                (in_stack_ffffffffffffffd0->scale,local_8,in_stack_ffffffffffffffd0->ptr);
    }
    __gnu_cxx::
    __normal_iterator<common_adapter_lora_info_*,_std::vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void common_set_adapter_lora(struct llama_context * ctx, std::vector<common_adapter_lora_info> & lora) {
    llama_clear_adapter_lora(ctx);
    for (auto & la : lora) {
        if (la.scale != 0.0f) {
            llama_set_adapter_lora(ctx, la.ptr, la.scale);
        }
    }
}